

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindFileContainingExtension_Test::TestBody
          (DescriptorDatabaseTest_FindFileContainingExtension_Test *this)

{
  DescriptorDatabase *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  char *in_R9;
  string local_ac8;
  AssertHelper local_aa8;
  Message local_aa0;
  allocator<char> local_a91;
  string local_a90 [39];
  bool local_a69;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar__7;
  FileDescriptorProto file_6;
  AssertHelper local_940;
  Message local_938;
  allocator<char> local_929;
  string local_928 [39];
  bool local_901;
  undefined1 local_900 [8];
  AssertionResult gtest_ar__6;
  FileDescriptorProto file_5;
  AssertHelper local_7d8;
  Message local_7d0;
  allocator<char> local_7c1;
  string local_7c0 [39];
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__5;
  FileDescriptorProto file_4;
  AssertHelper local_670;
  Message local_668;
  allocator<char> local_659;
  string local_658 [39];
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_600;
  Message local_5f8;
  allocator<char> local_5e9;
  string local_5e8 [39];
  bool local_5c1;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar__3;
  FileDescriptorProto file_3;
  Message local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_478;
  Message local_470;
  allocator<char> local_461;
  string local_460 [39];
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__2;
  FileDescriptorProto file_2;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2f0;
  Message local_2e8;
  allocator<char> local_2d9;
  string local_2d8 [39];
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__1;
  FileDescriptorProto file_1;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  AssertHelper local_168;
  Message local_160 [3];
  allocator<char> local_141;
  string local_140 [39];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file;
  DescriptorDatabaseTest_FindFileContainingExtension_Test *this_local;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"foo.proto\" message_type {   name: \"Foo\"   extension_range { start: 1 end: 1000 }   extension { name:\"qux\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5               extendee: \".Foo\" }}"
            );
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"bar.proto\" package: \"corge\" dependency: \"foo.proto\" message_type {   name: \"Bar\"   extension_range { start: 1 end: 1000 } } extension { name:\"grault\" extendee: \".Foo\"       number:32 } extension { name:\"garply\" extendee: \".corge.Bar\" number:70 } extension { name:\"waldo\"  extendee: \"Bar\"        number:56 } "
            );
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"Foo",&local_141);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_140,5,&gtest_ar_.message_);
  local_119 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_118,
               (AssertionResult *)"database_->FindFileContainingExtension(\"Foo\", 5, &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x139,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_198,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_1.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x13a,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_1.field_0 + 0xe0),&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_1.field_0 + 0xe0));
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"Foo",&local_2d9);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_2d8,0x20,&gtest_ar__1.message_);
  local_2b1 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_2b0,
               (AssertionResult *)"database_->FindFileContainingExtension(\"Foo\", 32, &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x13f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__1.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_320,"\"bar.proto\"","file.name()",(char (*) [10])0x1e1d7ee,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_2.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x140,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_2.field_0 + 0xe0),&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_2.field_0 + 0xe0));
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"corge.Bar",&local_461);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_460,0x46,&gtest_ar__2.message_);
  local_439 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar2) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_438,
               (AssertionResult *)"database_->FindFileContainingExtension(\"corge.Bar\", 70, &file)"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x146,pcVar4);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__2.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4a8,"\"bar.proto\"","file.name()",(char (*) [10])0x1e1d7ee,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar2) {
    testing::Message::Message(&local_4b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_3.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x147,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_3.field_0 + 0xe0),&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_3.field_0 + 0xe0));
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__3.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"Bar",&local_5e9);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_5e8,0x38,&gtest_ar__3.message_);
  local_5c1 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c0,&local_5c1,(type *)0x0);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar2) {
    testing::Message::Message(&local_5f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_5c0,
               (AssertionResult *)"database_->FindFileContainingExtension(\"Bar\", 56, &file)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x14e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_658,"corge.Bar",&local_659);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_658,0x38,&gtest_ar__3.message_);
  local_631 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,&local_631,(type *)0x0);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar2) {
    testing::Message::Message(&local_668);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&file_4.field_0 + 0xe0),(internal *)local_630,
               (AssertionResult *)"database_->FindFileContainingExtension(\"corge.Bar\", 56, &file)"
               ,"true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x150,pcVar4);
    testing::internal::AssertHelper::operator=(&local_670,&local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    std::__cxx11::string::~string((string *)((long)&file_4.field_0 + 0xe0));
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__3.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__5.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"Foo",&local_7c1);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_7c0,0xc,&gtest_ar__5.message_);
  local_799 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,&local_799,(type *)0x0);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar2) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&file_5.field_0 + 0xe0),(internal *)local_798,
               (AssertionResult *)"database_->FindFileContainingExtension(\"Foo\", 12, &file)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x156,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)((long)&file_5.field_0 + 0xe0));
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__5.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__6.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_928,"NoSuchType",&local_929);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_928,5,&gtest_ar__6.message_);
  local_901 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_900,&local_901,(type *)0x0);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator(&local_929);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar2) {
    testing::Message::Message(&local_938);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&file_6.field_0 + 0xe0),(internal *)local_900,
               (AssertionResult *)"database_->FindFileContainingExtension(\"NoSuchType\", 5, &file)"
               ,"true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x15d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_940,&local_938);
    testing::internal::AssertHelper::~AssertHelper(&local_940);
    std::__cxx11::string::~string((string *)((long)&file_6.field_0 + 0xe0));
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__6.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__7.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a90,"Bar",&local_a91);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[4])(pDVar1,local_a90,0x46,&gtest_ar__7.message_);
  local_a69 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a68,&local_a69,(type *)0x0);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator(&local_a91);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar2) {
    testing::Message::Message(&local_aa0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ac8,(internal *)local_a68,
               (AssertionResult *)"database_->FindFileContainingExtension(\"Bar\", 70, &file)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x163,pcVar4);
    testing::internal::AssertHelper::operator=(&local_aa8,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper(&local_aa8);
    std::__cxx11::string::~string((string *)&local_ac8);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__7.message_);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindFileContainingExtension) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  extension_range { start: 1 end: 1000 } "
      "  extension { name:\"qux\" label:LABEL_OPTIONAL type:TYPE_INT32 "
      "number:5 "
      "              extendee: \".Foo\" }"
      "}");
  AddToDatabase(
      "name: \"bar.proto\" "
      "package: \"corge\" "
      "dependency: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "  extension_range { start: 1 end: 1000 } "
      "} "
      "extension { name:\"grault\" extendee: \".Foo\"       number:32 } "
      "extension { name:\"garply\" extendee: \".corge.Bar\" number:70 } "
      "extension { name:\"waldo\"  extendee: \"Bar\"        number:56 } ");

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingExtension("Foo", 5, &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingExtension("Foo", 32, &file));
    EXPECT_EQ("bar.proto", file.name());
  }

  {
    // Can find extensions for qualified type names.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingExtension("corge.Bar", 70, &file));
    EXPECT_EQ("bar.proto", file.name());
  }

  {
    // Can't find extensions whose extendee was not fully-qualified in the
    // FileDescriptorProto.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingExtension("Bar", 56, &file));
    EXPECT_FALSE(
        database_->FindFileContainingExtension("corge.Bar", 56, &file));
  }

  {
    // Can't find non-existent extension numbers.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingExtension("Foo", 12, &file));
  }

  {
    // Can't find extensions for non-existent types.
    FileDescriptorProto file;
    EXPECT_FALSE(
        database_->FindFileContainingExtension("NoSuchType", 5, &file));
  }

  {
    // Can't find extensions for unqualified type names.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingExtension("Bar", 70, &file));
  }
}